

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O3

int32 mgau_dump(mgau_model_t *g,int32 type)

{
  float32 **ppfVar1;
  char *__s;
  mgau_t *pmVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (g == (mgau_model_t *)0x0) {
    __assert_fail("g != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d3,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  pmVar2 = g->mgau;
  if (pmVar2 == (mgau_t *)0x0) {
    __assert_fail("g->mgau != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d4,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (pmVar2->mean == (float32 **)0x0) {
    __assert_fail("g->mgau[0].mean != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d5,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (pmVar2->var == (float32 **)0x0) {
    __assert_fail("g->mgau[0].var != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d6,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (1 < type - 1U) {
    __assert_fail("type == MGAU_VAR || type == MGAU_MEAN",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d7,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  __s = (char *)__ckd_calloc__((long)g->veclen * 0x14,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                               ,0x1d8);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
          ,0x1da,"\n");
  if (type == 1) {
    if (0 < g->n_mgau) {
      pmVar2 = g->mgau;
      lVar3 = 0;
      do {
        ppfVar1 = pmVar2[lVar3].mean;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x1df,"Mean of %d\n");
        pmVar2 = g->mgau;
        if (0 < pmVar2[lVar3].n_comp) {
          uVar4 = 0;
          do {
            sprintf(__s,"Component %d",uVar4 & 0xffffffff);
            if (0 < g->veclen) {
              lVar5 = 0;
              do {
                sprintf(__s,"%s %f",(double)(float)ppfVar1[uVar4][lVar5],__s);
                lVar5 = lVar5 + 1;
              } while (lVar5 < g->veclen);
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                    ,0x1e6,"%s\n",__s);
            uVar4 = uVar4 + 1;
            pmVar2 = g->mgau;
          } while ((long)uVar4 < (long)pmVar2[lVar3].n_comp);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < g->n_mgau);
    }
  }
  else if (0 < g->n_mgau) {
    pmVar2 = g->mgau;
    lVar3 = 0;
    do {
      ppfVar1 = pmVar2[lVar3].var;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x1ed,"Variance of %d\n");
      pmVar2 = g->mgau;
      if (0 < pmVar2[lVar3].n_comp) {
        uVar4 = 0;
        do {
          sprintf(__s,"Component %d\n",uVar4 & 0xffffffff);
          if (0 < g->veclen) {
            lVar5 = 0;
            do {
              sprintf(__s,"%s %f",(double)(float)ppfVar1[uVar4][lVar5],__s);
              lVar5 = lVar5 + 1;
            } while (lVar5 < g->veclen);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,500,"%s\n",__s);
          uVar4 = uVar4 + 1;
          pmVar2 = g->mgau;
        } while ((long)uVar4 < (long)pmVar2[lVar3].n_comp);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < g->n_mgau);
  }
  ckd_free(__s);
  return 0;
}

Assistant:

int32
mgau_dump(mgau_model_t * g, int32 type)
{
    int32 d, c, i;
    char *tmpstr;
    mgau_t m;
    assert(g != NULL);
    assert(g->mgau != NULL);
    assert(g->mgau[0].mean != NULL);
    assert(g->mgau[0].var != NULL);
    assert(type == MGAU_VAR || type == MGAU_MEAN);
    tmpstr = ckd_calloc((mgau_veclen(g) * 20), sizeof(char));

    E_INFO("\n");

    if (type == MGAU_MEAN) {
        for (d = 0; d < mgau_n_mgau(g); d++) {
            m = g->mgau[d];
            E_INFO("Mean of %d\n", d);

            for (c = 0; c < mgau_n_comp(g, d); c++) {
                sprintf(tmpstr, "Component %d", c);
                for (i = 0; i < mgau_veclen(g); i++) {
                    sprintf(tmpstr, "%s %f", tmpstr, m.mean[c][i]);
                }
                E_INFO("%s\n", tmpstr);
            }
        }
    }
    if (type == MGAU_VAR) {
        for (d = 0; d < mgau_n_mgau(g); d++) {
            m = g->mgau[d];
            E_INFO("Variance of %d\n", d);

            for (c = 0; c < mgau_n_comp(g, d); c++) {
                sprintf(tmpstr, "Component %d\n", c);
                for (i = 0; i < mgau_veclen(g); i++) {
                    sprintf(tmpstr, "%s %f", tmpstr, m.var[c][i]);
                }
                E_INFO("%s\n", tmpstr);
            }
        }
    }

    ckd_free(tmpstr);
    return 0;
}